

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteString.cpp
# Opt level: O2

void __thiscall ByteString::ByteString(ByteString *this,unsigned_long longValue)

{
  uchar in_RAX [8];
  long lVar1;
  undefined8 uStack_20;
  uchar byteStrIn [8];
  
  this->_vptr_ByteString = (_func_int **)&PTR__ByteString_0019e890;
  (this->byteString).super__Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->byteString).super__Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->byteString).super__Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->byteString).super__Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>._M_impl.
  super__Tp_alloc_type._vptr_SecureAllocator = (_func_int **)&PTR__SecureAllocator_0019e8c8;
  lVar1 = 8;
  byteStrIn = in_RAX;
  while (lVar1 != 0) {
    byteStrIn[lVar1 + -1] = (uchar)longValue;
    longValue = longValue >> 8;
    lVar1 = lVar1 + -1;
  }
  uStack_20 = 0x15be08;
  std::vector<unsigned_char,_SecureAllocator<unsigned_char>_>::resize(&this->byteString,8);
  *(uchar (*) [8])
   (this->byteString).super__Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>._M_impl.
   super__Vector_impl_data._M_start = byteStrIn;
  return;
}

Assistant:

ByteString::ByteString(const unsigned long longValue)
{
	unsigned long setValue = longValue;

	// Convert the value to a big-endian byte string; N.B.: this code assumes that unsigned long
	// values are stored as a 64-bit value, which is a safe assumption on modern systems. It will
	// also properly handle a 32-bit value and will simply store 4 zeroes at the front of the
	// string. If at some point in time we get 128-bit architectures, the top 8 bytes of the value
	// will be discarded... (but hey, 640K is enough for everybody, right?)
	//
	// The reason for coding it this way is that implementations of SoftHSM will maintain
	// binary compatibility between eachothers background storage (i.e. a 32-bit SoftHSM version can
	// read the storage of a 64-bit version and vice versa under the assumption that the stored
	// values never exceed 32-bits, which is likely since these values are only used to encode
	// byte string lengths)
	unsigned char byteStrIn[8];
	
	for (size_t i = 0; i < 8; i++)
	{
		byteStrIn[7-i] = (unsigned char) (setValue & 0xFF);
		setValue >>= 8;
	}

	byteString.resize(8);
	memcpy(&byteString[0], byteStrIn, 8);
}